

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O1

int __thiscall audiofft::OouraFFT::init(OouraFFT *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  int iVar1;
  double dVar2;
  int iVar3;
  undefined1 auVar4 [16];
  
  if ((EVP_PKEY_CTX *)this->_size == ctx) {
    return in_EAX;
  }
  auVar4._8_4_ = (int)((ulong)ctx >> 0x20);
  auVar4._0_8_ = ctx;
  auVar4._12_4_ = 0x45300000;
  iVar3 = (int)ctx;
  dVar2 = (auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->_ip,(long)((int)dVar2 + 2));
  std::vector<double,_std::allocator<double>_>::resize(&this->_w,(ulong)ctx >> 1);
  std::vector<double,_std::allocator<double>_>::resize(&this->_buffer,(size_type)ctx);
  iVar1 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar1 = iVar3;
  }
  this->_size = (size_t)ctx;
  iVar1 = iVar1 >> 2;
  makewt(this,iVar1,
         (this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start,(this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  makect(this,iVar1,
         (this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start,(this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar1);
  return extraout_EAX;
}

Assistant:

virtual void init(size_t size) override
        {
          if (_size != size)
          {
            _ip.resize(2 + static_cast<int>(std::sqrt(static_cast<double>(size))));
            _w.resize(size / 2);
            _buffer.resize(size);
            _size = size;

            const int size4 = static_cast<int>(_size) / 4;
            makewt(size4, _ip.data(), _w.data());
            makect(size4, _ip.data(), _w.data() + size4);
          }
        }